

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillCMakeVariablePath(cmFindBase *this)

{
  string *b;
  bool bVar1;
  mapped_type *this_00;
  string var;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  b = &(this->super_cmFindCommon).CMakePathName;
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[6]>
            (&local_38,(char (*) [7])0x6cf18b,b,(char (*) [6])0x71956a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_PREFIX_PATH",&local_59);
  cmSearchPath::AddCMakePrefixPath(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmSearchPath::AddCMakePath(this_00,&local_38);
  bVar1 = std::operator==(b,"PROGRAM");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_APPBUNDLE_PATH",&local_59);
    cmSearchPath::AddCMakePath(this_00,&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_FRAMEWORK_PATH",&local_59);
    cmSearchPath::AddCMakePath(this_00,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmFindBase::FillCMakeVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];

  // Add CMake variables of the same name as the previous environment
  // variables CMAKE_*_PATH to be used most of the time with -D
  // command line options
  std::string var = cmStrCat("CMAKE_", this->CMakePathName, "_PATH");
  paths.AddCMakePrefixPath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}